

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::FinalizeTransaction
          (Coap *this,RequestHolder *aRequestHolder,Response *aResponse,Error *aResult)

{
  ResponseHandler handler;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_70;
  undefined1 local_50 [40];
  
  if ((aRequestHolder->mHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              (&local_70,&aRequestHolder->mHandler);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator=(&aRequestHolder->mHandler,(nullptr_t)0x0);
    Error::Error((Error *)local_50,aResult);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator()(&local_70,aResponse,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
  }
  RequestsCache::Eliminate(&this->mRequestsCache,aRequestHolder);
  return;
}

Assistant:

void Coap::FinalizeTransaction(const RequestHolder &aRequestHolder, const Response *aResponse, Error aResult)
{
    if (aRequestHolder.mHandler != nullptr)
    {
        auto handler = aRequestHolder.mHandler;

        // The user-provided handler may do anything that causing this
        // handler be recursively called (For example, user stops the CoAP
        // instance which will finalize all transactions). Set this handler
        // to null to stop a handler being recalled.
        aRequestHolder.mHandler = nullptr;
        handler(aResponse, aResult);
    }
    mRequestsCache.Eliminate(aRequestHolder);
}